

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

double wabt::interp::FloatSqrt<double>(double val)

{
  double dVar1;
  double val_local;
  
  dVar1 = sqrt(val);
  dVar1 = CanonNaN<double,_0>(dVar1);
  return dVar1;
}

Assistant:

T WABT_VECTORCALL FloatNearest(T val) { return CanonNaN(std::nearbyint(val)); }